

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementCableANCF::EvaluateSectionStrain
          (ChElementCableANCF *this,double eta,ChVector<double> *StrainV)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar *pSVar4;
  Scalar *pSVar5;
  int i;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar16;
  ChVectorDynamic<> mD;
  ChVector<double> vr_x;
  ChVector<double> vr_xx;
  ChVector<double> result;
  ShapeVector Ndd;
  ShapeVector Nd;
  ShapeVector N;
  ChMatrixNM<double,_3,_12> Sd;
  ChMatrixNM<double,_3,_12> Sdd;
  Matrix<double,__1,_1,_0,__1,_1> local_370;
  double local_360;
  ChVector<double> *local_358;
  ChVector<double> local_350;
  ChVector<double> local_338;
  Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_320;
  undefined8 local_310;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> local_300 [32];
  DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1> local_2e0 [32];
  undefined1 local_2c0 [32];
  int local_2a0 [72];
  DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> local_180 [336];
  
  local_358 = StrainV;
  if ((this->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    dVar8 = (eta + 1.0) * 0.5;
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1b])(this,local_2c0);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1c])(dVar8,this,local_2e0);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1d])(dVar8,this,local_300);
    local_2a0[0] = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase[3])(this);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_370,local_2a0);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,&local_370);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_> *)local_2a0);
    lVar7 = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_2e0,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_2a0,0,
                          lVar7);
      *pSVar5 = SVar1;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_2e0,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_2a0,1,
                          lVar7 + 1);
      *pSVar5 = SVar1;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_2e0,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_2a0,2,
                          lVar7 + 2);
      lVar7 = lVar7 + 3;
      *pSVar5 = SVar1;
    }
    Eigen::DenseBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>_>::setZero(local_180);
    lVar7 = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_300,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_180,0,
                          lVar7);
      *pSVar5 = SVar1;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_300,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_180,1,
                          lVar7 + 1);
      *pSVar5 = SVar1;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>,_1>::operator()
                         (local_300,lVar6);
      SVar1 = *pSVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_1> *)local_180,2,
                          lVar7 + 2);
      lVar7 = lVar7 + 3;
      *pSVar5 = SVar1;
    }
    PVar16 = Eigen::MatrixBase<Eigen::Matrix<double,3,12,1,3,12>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,3,12,1,3,12>> *)local_2a0,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_370);
    local_338.m_data[0] = (double)PVar16.m_lhs;
    local_338.m_data[1] = (double)PVar16.m_rhs;
    ChVector<double>::
    ChVector<Eigen::Product<Eigen::Matrix<double,3,12,1,3,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&local_350,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_338,(type *)0x0);
    local_320 = Eigen::MatrixBase<Eigen::Matrix<double,3,12,1,3,12>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,12,1,3,12>> *)local_180,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_370);
    ChVector<double>::
    ChVector<Eigen::Product<Eigen::Matrix<double,3,12,1,3,12>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&local_338,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_320,(type *)0x0);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_350.m_data[0];
    auVar13._8_8_ = local_350.m_data[2];
    auVar13._0_8_ = local_350.m_data[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_338.m_data[0];
    auVar15._8_8_ = local_338.m_data[2];
    auVar15._0_8_ = local_338.m_data[2];
    auVar2._8_8_ = local_350.m_data[2];
    auVar2._0_8_ = local_350.m_data[1];
    auVar3._8_8_ = local_338.m_data[2];
    auVar3._0_8_ = local_338.m_data[1];
    auVar11 = vunpcklpd_avx(auVar13,auVar12);
    auVar10 = vunpcklpd_avx(auVar15,auVar10);
    auVar14._0_8_ = local_338.m_data[1] * auVar11._0_8_;
    auVar14._8_8_ = local_338.m_data[2] * auVar11._8_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_338.m_data[0] * local_350.m_data[1];
    auVar11 = vfmsub231sd_fma(auVar11,auVar12,auVar3);
    local_320 = (Product<Eigen::Matrix<double,_3,_12,_1,_3,_12>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                 )vfmsub213pd_fma(auVar10,auVar2,auVar14);
    local_310 = auVar11._0_8_;
    dVar8 = ChVector<double>::Length((ChVector<double> *)&local_320);
    dVar9 = ChVector<double>::Length(&local_350);
    local_360 = pow(dVar9,3.0);
    dVar9 = ChVector<double>::Length2(&local_350);
    local_358->m_data[0] = dVar9 + -1.0;
    local_358->m_data[1] = dVar8 / local_360;
    Eigen::internal::handmade_aligned_free
              (local_370.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementCableANCF.cpp"
                ,700,
                "virtual void chrono::fea::ChElementCableANCF::EvaluateSectionStrain(const double, ChVector<> &)"
               );
}

Assistant:

void ChElementCableANCF::EvaluateSectionStrain(const double eta, ChVector<>& StrainV) {
    assert(section);

    ShapeVector N;
    ShapeVector Nd;
    ShapeVector Ndd;
    // double xi = (eta*2 - 1.0);
    double xi = (eta + 1.0) / 2.0;

    this->ShapeFunctions(N, xi);  // Evaluate shape functions
    this->ShapeFunctionsDerivatives(Nd, xi);
    this->ShapeFunctionsDerivatives2(Ndd, xi);
    ChVectorDynamic<> mD(GetNdofs());

    this->GetStateBlock(mD);

    ChMatrixNM<double, 3, 12> Sd;
    Sd.setZero();
    for (int i = 0; i < 4; i++) {
        Sd(0, 3 * i + 0) = Nd(i);
        Sd(1, 3 * i + 1) = Nd(i);
        Sd(2, 3 * i + 2) = Nd(i);
    }

    ChMatrixNM<double, 3, 12> Sdd;
    Sdd.setZero();
    for (int i = 0; i < 4; i++) {
        Sdd(0, 3 * i + 0) = Ndd(i);
        Sdd(1, 3 * i + 1) = Ndd(i);
        Sdd(2, 3 * i + 2) = Ndd(i);
    }

    ChVector<> vr_x(Sd * mD);
    ChVector<> vr_xx(Sdd * mD);
    ChVector<> vf1 = Vcross(vr_x, vr_xx);
    double f = vf1.Length();
    double g1 = vr_x.Length();
    double g = pow(g1, 3);

    StrainV.x() = vr_x.Length2() - 1.0;
    StrainV.y() = f / g;  // Bending strain measure (Gertmayer and Shabana, 2006)
}